

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLANG.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::
     verifyLANG<ranges::ref_view<std::vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>>const>>
               (int LANG,
               ref_view<const_std::vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>_>
               *sequence)

{
  borrowed_iterator_t<const_ranges::ref_view<const_std::vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>_&>
  bVar1;
  undefined8 *puVar2;
  char *unaff_RBX;
  
  bVar1 = ranges::find_if_not_fn::
          operator()<const_ranges::ref_view<const_std::vector<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_26_ContinuumEnergyAngle_src_verifyLANG_hpp:5:18),_ranges::identity,_true,_0,_0>
                    ((find_if_not_fn *)&ranges::find_if_not,sequence,LANG);
  if (bVar1._M_current ==
      (sequence->rng_->
      super__Vector_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  tools::Log::error<char_const*>(unaff_RBX);
  tools::Log::info<char_const*,int,long>
            ("Expected LANG={} for the subsection with index={}",LANG,
             ((long)bVar1._M_current -
             (long)(sequence->rng_->
                   super__Vector_base<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::LegendreCoefficients>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x48);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLANG( int LANG, const Array& sequence ) {

  auto compare = [LANG] ( const auto& entry )
                        { return entry.LANG() == LANG; };

  auto iter = ranges::cpp20::find_if_not( sequence, compare );

  if ( iter != ranges::cpp20::end( sequence ) ) {

    Log::error( "All subsections must use the same LANG format option" );
    Log::info( "Expected LANG={} for the subsection with index={}", LANG,
               ranges::cpp20::distance(
                   ranges::cpp20::begin( sequence ), iter ) );
    throw std::exception();
  }
}